

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

Status cmsys::SystemTools::RemoveADirectory(string *source)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Status SVar4;
  unsigned_long uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong dindex;
  Directory dir;
  string fullPath;
  stat fs;
  Directory local_f0;
  mode_t local_e4;
  string local_e0;
  stat local_c0;
  
  local_e4 = 0;
  SVar4 = GetPermissions(source,&local_e4);
  if (SVar4.Kind_ == Success) {
    SetPermissions(source,local_e4 | 0x180,false);
  }
  Directory::Directory(&local_f0);
  SVar4 = Directory::Load(&local_f0,source,(string *)0x0);
  uVar7 = (ulong)SVar4 >> 0x20;
  if (SVar4.Kind_ == Success) {
    dindex = 0;
    while( true ) {
      uVar5 = Directory::GetNumberOfFiles(&local_f0);
      if (uVar5 <= dindex) break;
      pcVar6 = Directory::GetFile(&local_f0,dindex);
      if ((*pcVar6 != '.') || (pcVar6[1] != '\0')) {
        pcVar6 = Directory::GetFile(&local_f0,dindex);
        if ((*pcVar6 != '.') || ((pcVar6[1] != '.' || (pcVar6[2] != '\0')))) {
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          pcVar1 = (source->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,pcVar1,pcVar1 + source->_M_string_length);
          std::__cxx11::string::append((char *)&local_e0);
          Directory::GetFile(&local_f0,dindex);
          std::__cxx11::string::append((char *)&local_e0);
          bVar2 = FileIsDirectory(&local_e0);
          if (bVar2) {
            iVar3 = lstat(local_e0._M_dataplus._M_p,&local_c0);
            if ((iVar3 == 0) && ((local_c0.st_mode & 0xf000) == 0xa000)) goto LAB_0011a654;
            SVar4 = RemoveADirectory(&local_e0);
          }
          else {
LAB_0011a654:
            SVar4 = RemoveFile(&local_e0);
          }
          uVar7 = (ulong)SVar4 >> 0x20;
          if (SVar4.Kind_ != Success) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0011a565;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      dindex = dindex + 1;
    }
    iVar3 = rmdir((source->_M_dataplus)._M_p);
    if (iVar3 == 0) {
      SVar4.Kind_ = Success;
      SVar4.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
    }
    else {
      SVar4 = Status::POSIX_errno();
      uVar7 = (ulong)SVar4 >> 0x20;
    }
  }
LAB_0011a565:
  Directory::~Directory(&local_f0);
  return (Status)((ulong)SVar4 & 0xffffffff | uVar7 << 0x20);
}

Assistant:

Status SystemTools::RemoveADirectory(std::string const& source)
{
  // Add read and write permission to the directory so we can read
  // and modify its content to remove files and directories from it.
  mode_t mode = 0;
  if (SystemTools::GetPermissions(source, mode)) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    mode |= S_IREAD | S_IWRITE;
#else
    mode |= S_IRUSR | S_IWUSR;
#endif
    SystemTools::SetPermissions(source, mode);
  }

  Status status;
  Directory dir;
  status = dir.Load(source);
  if (!status.IsSuccess()) {
    return status;
  }

  size_t fileNum;
  for (fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") != 0 &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..") != 0) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath) &&
          !SystemTools::FileIsSymlink(fullPath)) {
        status = SystemTools::RemoveADirectory(fullPath);
        if (!status.IsSuccess()) {
          return status;
        }
      } else {
        status = SystemTools::RemoveFile(fullPath);
        if (!status.IsSuccess()) {
          return status;
        }
      }
    }
  }

  if (Rmdir(source) != 0) {
    status = Status::POSIX_errno();
  }
  return status;
}